

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  TestEventRepeater *pTVar1;
  pointer ppTVar2;
  UnitTestImpl *pUVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  TestInfo **ppTVar7;
  pointer ppTVar8;
  long lVar9;
  OsStackTraceGetterInterface *pOVar10;
  undefined **ppuVar11;
  pair<testing::TestInfo_**,_long> pVar12;
  
  if (this->should_run_ != true) {
    return;
  }
  UnitTest::GetInstance();
  pUVar3 = UnitTest::GetInstance::instance.impl_;
  (UnitTest::GetInstance::instance.impl_)->current_test_suite_ = this;
  UnitTest::GetInstance();
  pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
  ppTVar8 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar2 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar8 != ppTVar2) {
    lVar6 = (long)ppTVar2 - (long)ppTVar8 >> 3;
    pVar12 = std::get_temporary_buffer<testing::TestInfo*>((lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
    lVar6 = pVar12.second;
    ppTVar7 = pVar12.first;
    if (ppTVar7 == (TestInfo **)0x0) {
      lVar6 = 0;
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<testing::TestInfo**,std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>>,__gnu_cxx::__ops::_Iter_comp_iter<testing::TestSuite::Run()::__0>>
                (ppTVar8,ppTVar2);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<testing::TestInfo**,std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>>,testing::TestInfo**,long,__gnu_cxx::__ops::_Iter_comp_iter<testing::TestSuite::Run()::__0>>
                (ppTVar8,ppTVar2,ppTVar7,lVar6);
    }
    operator_delete(ppTVar7,lVar6 << 3);
  }
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[7])(pTVar1,this);
  if (pUVar3->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
    pOVar10 = (OsStackTraceGetterInterface *)operator_new(8);
    ppuVar11 = &PTR__OsStackTraceGetterInterface_0015c4d0;
    pOVar10->_vptr_OsStackTraceGetterInterface =
         (_func_int **)&PTR__OsStackTraceGetterInterface_0015c4d0;
    pUVar3->os_stack_trace_getter_ = pOVar10;
  }
  else {
    ppuVar11 = pUVar3->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
  }
  (*((_func_int **)ppuVar11)[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x139580,(char *)0x0);
  bVar4 = TestResult::Failed(&this->ad_hoc_test_result_);
  bVar5 = true;
  if (!bVar4) {
    bVar5 = TestResult::Skipped(&this->ad_hoc_test_result_);
  }
  lVar6 = std::chrono::_V2::system_clock::now();
  this->start_timestamp_ = lVar6 / 1000000;
  lVar6 = std::chrono::_V2::steady_clock::now();
  ppTVar8 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8) >> 3)) {
    lVar9 = 1;
    do {
      if (bVar5 == false) {
        TestInfo::Run(ppTVar8[(uint)(this->test_indices_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar9 + -1]]);
      }
      else {
        TestInfo::Skip(ppTVar8[(uint)(this->test_indices_).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar9 + -1]]);
      }
      if ((FLAGS_gtest_fail_fast == '\x01') &&
         (bVar4 = TestResult::Failed(&(this->test_info_list_).
                                      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [(uint)(this->test_indices_).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[lVar9 + -1]]->result_)
         , bVar4)) goto LAB_00126882;
      ppTVar8 = (this->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar4 = lVar9 < (int)((ulong)((long)(this->test_info_list_).
                                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8
                                   ) >> 3);
      lVar9 = lVar9 + 1;
    } while (bVar4);
  }
LAB_00126896:
  lVar9 = std::chrono::_V2::steady_clock::now();
  this->elapsed_time_ = (lVar9 - lVar6) / 1000000;
  if (pUVar3->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
    pOVar10 = (OsStackTraceGetterInterface *)operator_new(8);
    ppuVar11 = &PTR__OsStackTraceGetterInterface_0015c4d0;
    pOVar10->_vptr_OsStackTraceGetterInterface =
         (_func_int **)&PTR__OsStackTraceGetterInterface_0015c4d0;
    pUVar3->os_stack_trace_getter_ = pOVar10;
  }
  else {
    ppuVar11 = pUVar3->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
  }
  (*((_func_int **)ppuVar11)[3])();
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x13958c,(char *)0x0);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xd])(pTVar1,this);
  pUVar3->current_test_suite_ = (TestSuite *)0x0;
  return;
LAB_00126882:
  for (; ppTVar8 = (this->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
      (int)lVar9 <
      (int)((ulong)((long)(this->test_info_list_).
                          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8) >> 3);
      lVar9 = lVar9 + 1) {
    TestInfo::Skip(ppTVar8[(uint)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar9]]);
  }
  goto LAB_00126896;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Ensure our tests are in a deterministic order.
  //
  // We do this by sorting lexicographically on (file, line number), providing
  // an order matching what the user can see in the source code.
  //
  // In the common case the line number comparison shouldn't be necessary,
  // because the registrations made by the TEST macro are executed in order
  // within a translation unit. But this is not true of the manual registration
  // API, and in more exotic scenarios a single file may be part of multiple
  // translation units.
  std::stable_sort(test_info_list_.begin(), test_info_list_.end(),
                   [](const TestInfo* const a, const TestInfo* const b) {
                     if (const int result = std::strcmp(a->file(), b->file())) {
                       return result < 0;
                     }

                     return a->line() < b->line();
                   });

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  const bool skip_all =
      ad_hoc_test_result().Failed() || ad_hoc_test_result().Skipped();

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    if (skip_all) {
      GetMutableTestInfo(i)->Skip();
    } else {
      GetMutableTestInfo(i)->Run();
    }
    if (GTEST_FLAG_GET(fail_fast) &&
        GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->set_current_test_suite(nullptr);
}